

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void const_array_suite::expand_front(void)

{
  ulong uVar1;
  basic_iterator<const_int> first_end;
  basic_iterator<const_int> first_end_00;
  ulong uVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<const_int> first_begin;
  basic_iterator<const_int> first_begin_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<const_int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<const_int,_18446744073709551615UL> local_68;
  int local_44 [3];
  circular_view<const_int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  view_pointer local_28;
  undefined8 uStack_20;
  type local_18 [4];
  
  local_68.member.data = local_18;
  local_18[0] = 0xb;
  local_18[1] = 0x16;
  local_18[2] = 0x21;
  local_18[3] = 0;
  local_68.member.cap = 3;
  local_68.member.size = 3;
  local_68.member.next = 3;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x3;
  local_44[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7d7,"void const_array_suite::expand_front()",&local_80,local_44);
  local_44[0] = 0xb;
  local_44[1] = 0x16;
  local_44[2] = 0x21;
  __l._M_len = 3;
  __l._M_array = local_44;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
  local_28 = &local_68;
  uStack_20 = 3;
  first_end.current = 3;
  first_end.parent = local_28;
  first_begin.current = 0;
  first_begin.parent = local_28;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7db,"void const_array_suite::expand_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<const_int,_18446744073709551615UL>::expand_front(&local_68,1);
  local_44[0] = 0x21;
  local_44[1] = 0xb;
  local_44[2] = 0x16;
  __l_00._M_len = 3;
  __l_00._M_array = local_44;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_00,&local_81);
  uVar1 = local_68.member.cap * 2;
  if ((uVar1 & local_68.member.cap * 2 - 1) == 0) {
    uVar2 = local_68.member.next - local_68.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_68.member.next;
  }
  else {
    uVar2 = (local_68.member.next - local_68.member.size) % uVar1;
    sStack_30 = local_68.member.next % uVar1;
  }
  first_end_00.current = sStack_30;
  first_end_00.parent = &local_68;
  first_begin_00.current = uVar2;
  first_begin_00.parent = &local_68;
  local_38 = &local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7e1,"void const_array_suite::expand_front()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_front()
{
    int array[4] = { 11, 22, 33 };
    circular_view<const int> span(&array[0], &array[3],
                                   &array[0], 3);
    BOOST_TEST_EQ(span.capacity(), 3);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 33, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}